

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_spy_Hook_amd64_gcc.cpp
# Opt level: O1

Hook * __thiscall
axl::spy::HookArena::allocate
          (HookArena *this,void *targetFunc,void *callbackParam,HookEnterFunc *enterFunc,
          HookLeaveFunc *leaveFunc)

{
  Hook *dst;
  
  dst = mem::ExecutableBlockArena<axl::spy::Hook>::allocate
                  ((ExecutableBlockArena<axl::spy::Hook> *)this->m_impl);
  if (dst == (Hook *)0x0) {
    dst = (Hook *)0x0;
  }
  else {
    __wrap_memcpy(dst,g_thunkCode,0x199);
    *(Hook **)(dst->m_thunkCode + 0x5f) = dst;
    *(Hook **)(dst->m_thunkCode + 0x154) = dst;
    *(void **)(dst->m_thunkCode + 0xf4) = targetFunc;
    *(uint8_t **)(dst->m_thunkCode + 0xe6) = dst->m_thunkCode + 0x125;
    *(code **)(dst->m_thunkCode + 0x70) = hookEnter;
    *(code **)(dst->m_thunkCode + 0x164) = hookLeave;
    (dst->m_context).m_targetFunc = targetFunc;
    (dst->m_context).m_callbackParam = callbackParam;
    (dst->m_context).m_enterFunc = enterFunc;
    (dst->m_context).m_leaveFunc = leaveFunc;
  }
  return dst;
}

Assistant:

Hook*
HookArena::allocate(
	void* targetFunc,
	void* callbackParam,
	HookEnterFunc* enterFunc,
	HookLeaveFunc* leaveFunc
) {
	Hook* hook = ((mem::ExecutableBlockArena<Hook>*)m_impl)->allocate();
	if (!hook)
		return NULL;

	memcpy(hook->m_thunkCode, g_thunkCode, sizeof(g_thunkCode));
	*(void**)(hook->m_thunkCode + ThunkCodeOffset_HookPtr1) = hook;
	*(void**)(hook->m_thunkCode + ThunkCodeOffset_HookPtr2) = hook;
	*(void**)(hook->m_thunkCode + ThunkCodeOffset_TargetFuncPtr) = targetFunc;
	*(void**)(hook->m_thunkCode + ThunkCodeOffset_HookRetPtr) = hook->m_thunkCode + ThunkCodeOffset_HookRet;
	*(void**)(hook->m_thunkCode + ThunkCodeOffset_HookEnterPtr) = (void*)hookEnter;
	*(void**)(hook->m_thunkCode + ThunkCodeOffset_HookLeavePtr) = (void*)hookLeave;

	hook->m_context.m_targetFunc = targetFunc;
	hook->m_context.m_callbackParam = callbackParam;
	hook->m_context.m_enterFunc = enterFunc;
	hook->m_context.m_leaveFunc = leaveFunc;
	return hook;
}